

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

_Bool avx2_hasspace(char *bytes,size_t howmany)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 (*pauVar10) [32];
  ulong in_RSI;
  long in_RDI;
  undefined1 auVar11 [16];
  char c;
  __m256i anywhite;
  __m256i xcarriage;
  __m256i xnewline;
  __m256i xspaces;
  __m256i x;
  size_t i;
  __m256i carriage;
  __m256i newline;
  __m256i spaces;
  ulong local_308;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar2 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar2 = vpinsrb_avx(auVar2,0x20,2);
  auVar2 = vpinsrb_avx(auVar2,0x20,3);
  auVar2 = vpinsrb_avx(auVar2,0x20,4);
  auVar2 = vpinsrb_avx(auVar2,0x20,5);
  auVar2 = vpinsrb_avx(auVar2,0x20,6);
  auVar2 = vpinsrb_avx(auVar2,0x20,7);
  auVar2 = vpinsrb_avx(auVar2,0x20,8);
  auVar2 = vpinsrb_avx(auVar2,0x20,9);
  auVar2 = vpinsrb_avx(auVar2,0x20,10);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar3 = vpinsrb_avx(auVar3,0x20,2);
  auVar3 = vpinsrb_avx(auVar3,0x20,3);
  auVar3 = vpinsrb_avx(auVar3,0x20,4);
  auVar3 = vpinsrb_avx(auVar3,0x20,5);
  auVar3 = vpinsrb_avx(auVar3,0x20,6);
  auVar3 = vpinsrb_avx(auVar3,0x20,7);
  auVar3 = vpinsrb_avx(auVar3,0x20,8);
  auVar3 = vpinsrb_avx(auVar3,0x20,9);
  auVar3 = vpinsrb_avx(auVar3,0x20,10);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xb);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xc);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xd);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xe);
  auVar3 = vpinsrb_avx(auVar3,0x20,0xf);
  uStack_f0 = auVar3._0_8_;
  uStack_e8 = auVar3._8_8_;
  auVar3 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar3 = vpinsrb_avx(auVar3,10,2);
  auVar3 = vpinsrb_avx(auVar3,10,3);
  auVar3 = vpinsrb_avx(auVar3,10,4);
  auVar3 = vpinsrb_avx(auVar3,10,5);
  auVar3 = vpinsrb_avx(auVar3,10,6);
  auVar3 = vpinsrb_avx(auVar3,10,7);
  auVar3 = vpinsrb_avx(auVar3,10,8);
  auVar3 = vpinsrb_avx(auVar3,10,9);
  auVar3 = vpinsrb_avx(auVar3,10,10);
  auVar3 = vpinsrb_avx(auVar3,10,0xb);
  auVar3 = vpinsrb_avx(auVar3,10,0xc);
  auVar3 = vpinsrb_avx(auVar3,10,0xd);
  auVar3 = vpinsrb_avx(auVar3,10,0xe);
  auVar3 = vpinsrb_avx(auVar3,10,0xf);
  auVar4 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar4 = vpinsrb_avx(auVar4,10,2);
  auVar4 = vpinsrb_avx(auVar4,10,3);
  auVar4 = vpinsrb_avx(auVar4,10,4);
  auVar4 = vpinsrb_avx(auVar4,10,5);
  auVar4 = vpinsrb_avx(auVar4,10,6);
  auVar4 = vpinsrb_avx(auVar4,10,7);
  auVar4 = vpinsrb_avx(auVar4,10,8);
  auVar4 = vpinsrb_avx(auVar4,10,9);
  auVar4 = vpinsrb_avx(auVar4,10,10);
  auVar4 = vpinsrb_avx(auVar4,10,0xb);
  auVar4 = vpinsrb_avx(auVar4,10,0xc);
  auVar4 = vpinsrb_avx(auVar4,10,0xd);
  auVar4 = vpinsrb_avx(auVar4,10,0xe);
  auVar4 = vpinsrb_avx(auVar4,10,0xf);
  uStack_b0 = auVar4._0_8_;
  uStack_a8 = auVar4._8_8_;
  auVar4 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar4 = vpinsrb_avx(auVar4,0xd,2);
  auVar4 = vpinsrb_avx(auVar4,0xd,3);
  auVar4 = vpinsrb_avx(auVar4,0xd,4);
  auVar4 = vpinsrb_avx(auVar4,0xd,5);
  auVar4 = vpinsrb_avx(auVar4,0xd,6);
  auVar4 = vpinsrb_avx(auVar4,0xd,7);
  auVar4 = vpinsrb_avx(auVar4,0xd,8);
  auVar4 = vpinsrb_avx(auVar4,0xd,9);
  auVar4 = vpinsrb_avx(auVar4,0xd,10);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xb);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xc);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xd);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xe);
  auVar4 = vpinsrb_avx(auVar4,0xd,0xf);
  auVar5 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar5 = vpinsrb_avx(auVar5,0xd,2);
  auVar5 = vpinsrb_avx(auVar5,0xd,3);
  auVar5 = vpinsrb_avx(auVar5,0xd,4);
  auVar5 = vpinsrb_avx(auVar5,0xd,5);
  auVar5 = vpinsrb_avx(auVar5,0xd,6);
  auVar5 = vpinsrb_avx(auVar5,0xd,7);
  auVar5 = vpinsrb_avx(auVar5,0xd,8);
  auVar5 = vpinsrb_avx(auVar5,0xd,9);
  auVar5 = vpinsrb_avx(auVar5,0xd,10);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xb);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xc);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xd);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xe);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xf);
  auVar11 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  uStack_70 = auVar11._0_8_;
  uStack_68 = auVar11._8_8_;
  for (local_308 = 0; local_308 + 0x1f < in_RSI; local_308 = local_308 + 0x20) {
    pauVar10 = (undefined1 (*) [32])(in_RDI + local_308);
    auVar6._16_8_ = uStack_f0;
    auVar6._0_16_ = auVar2;
    auVar6._24_8_ = uStack_e8;
    auVar6 = vpcmpeqb_avx2(*pauVar10,auVar6);
    auVar7._16_8_ = uStack_b0;
    auVar7._0_16_ = auVar3;
    auVar7._24_8_ = uStack_a8;
    auVar7 = vpcmpeqb_avx2(*pauVar10,auVar7);
    auVar9._16_8_ = uStack_70;
    auVar9._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
    auVar9._24_8_ = uStack_68;
    uVar8 = vpcmpeqb_avx512vl(*pauVar10,auVar9);
    auVar9 = vpmovm2b_avx512vl(uVar8);
    auVar6 = vpor_avx2(auVar6,auVar7);
    auVar6 = vpor_avx2(auVar6,auVar9);
    if (POPCOUNT((uint)(SUB321(auVar6 >> 7,0) & 1) | (uint)(SUB321(auVar6 >> 0xf,0) & 1) << 1 |
                 (uint)(SUB321(auVar6 >> 0x17,0) & 1) << 2 |
                 (uint)(SUB321(auVar6 >> 0x1f,0) & 1) << 3 |
                 (uint)(SUB321(auVar6 >> 0x27,0) & 1) << 4 |
                 (uint)(SUB321(auVar6 >> 0x2f,0) & 1) << 5 |
                 (uint)(SUB321(auVar6 >> 0x37,0) & 1) << 6 |
                 (uint)(SUB321(auVar6 >> 0x3f,0) & 1) << 7 |
                 (uint)(SUB321(auVar6 >> 0x47,0) & 1) << 8 |
                 (uint)(SUB321(auVar6 >> 0x4f,0) & 1) << 9 |
                 (uint)(SUB321(auVar6 >> 0x57,0) & 1) << 10 |
                 (uint)(SUB321(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (uint)(SUB321(auVar6 >> 0x67,0) & 1) << 0xc |
                 (uint)(SUB321(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (uint)(SUB321(auVar6 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar6 >> 0x7f,0) << 0xf
                 | (uint)(SUB321(auVar6 >> 0x87,0) & 1) << 0x10 |
                 (uint)(SUB321(auVar6 >> 0x8f,0) & 1) << 0x11 |
                 (uint)(SUB321(auVar6 >> 0x97,0) & 1) << 0x12 |
                 (uint)(SUB321(auVar6 >> 0x9f,0) & 1) << 0x13 |
                 (uint)(SUB321(auVar6 >> 0xa7,0) & 1) << 0x14 |
                 (uint)(SUB321(auVar6 >> 0xaf,0) & 1) << 0x15 |
                 (uint)(SUB321(auVar6 >> 0xb7,0) & 1) << 0x16 |
                 (uint)SUB321(auVar6 >> 0xbf,0) << 0x17 |
                 (uint)(SUB321(auVar6 >> 199,0) & 1) << 0x18 |
                 (uint)(SUB321(auVar6 >> 0xcf,0) & 1) << 0x19 |
                 (uint)(SUB321(auVar6 >> 0xd7,0) & 1) << 0x1a |
                 (uint)(SUB321(auVar6 >> 0xdf,0) & 1) << 0x1b |
                 (uint)(SUB321(auVar6 >> 0xe7,0) & 1) << 0x1c |
                 (uint)(SUB321(auVar6 >> 0xef,0) & 1) << 0x1d |
                 (uint)(SUB321(auVar6 >> 0xf7,0) & 1) << 0x1e |
                 (uint)(byte)(auVar6[0x1f] >> 7) << 0x1f) != 0) {
      return true;
    }
  }
  while( true ) {
    if (in_RSI <= local_308) {
      return false;
    }
    cVar1 = *(char *)(in_RDI + local_308);
    if (((cVar1 == '\r') || (cVar1 == '\n')) || (cVar1 == ' ')) break;
    local_308 = local_308 + 1;
  }
  return true;
}

Assistant:

bool avx2_hasspace(const char *bytes, size_t howmany) {
	__m256i spaces = _mm256_set1_epi8(' ');
	__m256i newline = _mm256_set1_epi8('\n');
	__m256i carriage = _mm256_set1_epi8('\r');
	size_t i = 0;
	for (; i + 31 < howmany; i += 32) {
		__m256i x = _mm256_loadu_si256((const __m256i *)(bytes + i));
		// we do it the naive way, could be smarter?
		__m256i xspaces = _mm256_cmpeq_epi8(x, spaces);
		__m256i xnewline = _mm256_cmpeq_epi8(x, newline);
		__m256i xcarriage = _mm256_cmpeq_epi8(x, carriage);
		__m256i anywhite =
		_mm256_or_si256(_mm256_or_si256(xspaces, xnewline), xcarriage);
		if(_mm_popcnt_u32(_mm256_movemask_epi8(anywhite)) != 0) {
			return true;
		}
	}
	for (; i < howmany; i++) {
		char c = bytes[i];
		if (c == '\r' || c == '\n' || c == ' ') {
			return true;
		}
	}
	return false;
}